

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::CodeHolder::CodeHolder(CodeHolder *this,Temporary *temporary)

{
  Zone *pZVar1;
  size_t in_RSI;
  Zone *in_RDI;
  Temporary *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  
  pZVar1 = in_RDI;
  memset(in_RDI,0,8);
  *in_RDI = (Zone)0x0;
  in_RDI[1] = (Zone)0x0;
  in_RDI[2] = (Zone)0x0;
  in_RDI[3] = (Zone)0x0;
  in_RDI[4] = (Zone)0x0;
  in_RDI[5] = (Zone)0x0;
  in_RDI[6] = (Zone)0x0;
  in_RDI[7] = (Zone)0x0;
  memset(in_RDI + 8,0,0x20);
  *(undefined8 *)(in_RDI + 0x28) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  Zone::_init(pZVar1,in_RSI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  *(Zone **)(in_RDI + 0x68) = in_RDI + 0x40;
  pZVar1 = in_RDI + 0x70;
  do {
    *(undefined8 *)pZVar1 = 0;
    pZVar1 = pZVar1 + 8;
  } while (pZVar1 != in_RDI + 0xc0);
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  ZoneVectorBase::ZoneVectorBase((ZoneVectorBase *)(in_RDI + 200));
  ZoneVectorBase::ZoneVectorBase((ZoneVectorBase *)(in_RDI + 0xd8));
  ZoneVectorBase::ZoneVectorBase((ZoneVectorBase *)(in_RDI + 0xe8));
  ZoneVectorBase::ZoneVectorBase((ZoneVectorBase *)(in_RDI + 0xf8));
  ZoneVectorBase::ZoneVectorBase((ZoneVectorBase *)(in_RDI + 0x108));
  ZoneHashBase::reset((ZoneHashBase *)(in_RDI + 0x118));
  *(undefined8 *)(in_RDI + 0x140) = 0;
  *(undefined8 *)(in_RDI + 0x148) = 0;
  *(undefined8 *)(in_RDI + 0x150) = 0;
  return;
}

Assistant:

CodeHolder::CodeHolder(const Support::Temporary* temporary) noexcept
  : _environment(),
    _cpuFeatures{},
    _baseAddress(Globals::kNoBaseAddress),
    _logger(nullptr),
    _errorHandler(nullptr),
    _zone(16u * 1024u, 1, temporary),
    _allocator(&_zone),
    _unresolvedLinkCount(0),
    _addressTableSection(nullptr) {}